

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_bson.hpp
# Opt level: O2

type jsoncons::bson::
     encode_bson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j,ostream *os,
               bson_encode_options *options)

{
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>,_void>
  adaptor;
  bson_stream_encoder encoder;
  allocator<char> local_f1;
  binary_stream_sink local_f0;
  basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> local_b8;
  
  binary_stream_sink::binary_stream_sink(&local_f0,os);
  basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::basic_bson_encoder
            (&local_b8,&local_f0,options,&local_f1);
  binary_stream_sink::~binary_stream_sink(&local_f0);
  local_f0.stream_ptr_ =
       (basic_ostream<char,_std::char_traits<char>_> *)&PTR__basic_json_visitor_00999948;
  local_f0.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_b8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
            (j,(basic_json_visitor<char> *)&local_f0);
  basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::~basic_bson_encoder
            (&local_b8);
  return;
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value,void>::type 
    encode_bson(const T& j, 
                std::ostream& os, 
                const bson_encode_options& options = bson_encode_options())
    {
        using char_type = typename T::char_type;
        bson_stream_encoder encoder(os, options);
        auto adaptor = make_json_visitor_adaptor<basic_json_visitor<char_type>>(encoder);
        j.dump(adaptor);
    }